

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackableobject.h
# Opt level: O2

void __thiscall
Trackableobject::Trackableobject(Trackableobject *this,int _objectID,centroid c,rect *r)

{
  pair<centroid,_rect> local_48;
  
  std::
  queue<std::pair<centroid,rect>,std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>>
  ::queue<std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>,void>
            (&this->locations);
  std::
  queue<std::pair<float,float>,std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>>
  ::queue<std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>,void>
            (&this->speeds);
  std::
  queue<std::pair<float,float>,std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>>
  ::queue<std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>,void>
            (&this->accelerations);
  (this->lastlocation).first = 0.0;
  (this->lastlocation).second = 0.0;
  (this->lastspeed).first = 0.0;
  (this->lastspeed).second = 0.0;
  this->objectID = _objectID;
  this->maxRemenbers = 100;
  local_48.second.x1 = r->x1;
  local_48.second.y1 = r->y1;
  local_48.second.x2 = r->x2;
  local_48.second.y2 = r->y2;
  local_48.first = c;
  std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>::
  emplace_back<std::pair<centroid,rect>>
            ((deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>> *)this,
             &local_48);
  (this->lastlocation).first = (float)c.x;
  (this->lastlocation).second = (float)c.y;
  return;
}

Assistant:

Trackableobject(int _objectID, centroid c, rect r) {
		this->objectID = _objectID;
		maxRemenbers = 100;
		this->locations.push(std::pair<centroid, rect>(c, r));

		lastlocation = std::pair<float, float>(c.x, c.y);
	}